

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

int fmt::v5::vfprintf<char[3],char>
              (FILE *f,char (*format) [3],
              basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              args)

{
  basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  args_00;
  size_t __n;
  char *__ptr;
  size_t sVar1;
  FILE *in_RDI;
  basic_string_view<char> bVar2;
  size_t size;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  allocator<char> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>_2
  in_stack_fffffffffffffdb0;
  basic_string_view<char> in_stack_fffffffffffffdb8;
  basic_buffer<char> local_238 [17];
  FILE *local_18;
  
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),in_stack_fffffffffffffd48
            );
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdc7);
  bVar2 = to_string_view<char>((char *)0x13fc01);
  args_00.field_1.args_ = in_stack_fffffffffffffdb0.args_;
  args_00.types_ = bVar2.size_;
  internal::
  printf<char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
            ((basic_buffer<char> *)bVar2.data_,in_stack_fffffffffffffdb8,args_00);
  __n = internal::basic_buffer<char>::size(local_238);
  __ptr = internal::basic_buffer<char>::data(local_238);
  sVar1 = fwrite(__ptr,1,__n,local_18);
  if (sVar1 < __n) {
    iVar3 = -1;
  }
  else {
    iVar3 = (int)__n;
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)CONCAT44(iVar3,iVar3));
  return iVar3;
}

Assistant:

inline int vfprintf(std::FILE *f, const S &format,
                    basic_format_args<typename basic_printf_context_t<
                      internal::basic_buffer<Char>>::type> args) {
  basic_memory_buffer<Char> buffer;
  printf(buffer, to_string_view(format), args);
  std::size_t size = buffer.size();
  return std::fwrite(
    buffer.data(), sizeof(Char), size, f) < size ? -1 : static_cast<int>(size);
}